

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall QTableModel::setData(QTableModel *this,QModelIndex *index,QVariant *value,int role)

{
  QTableWidgetItem *pQVar1;
  QTableWidget *this_00;
  
  if (index->r < 0) {
    return false;
  }
  if (index->c < 0) {
    return false;
  }
  if ((index->m).ptr == (QAbstractItemModel *)0x0) {
    return false;
  }
  pQVar1 = item(this,index);
  if (pQVar1 == (QTableWidgetItem *)0x0) {
    if (*(ulong *)&(value->d).field_0x18 < 4) {
      return false;
    }
    this_00 = (QTableWidget *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
    if (this_00 == (QTableWidget *)0x0) {
      return this_00 != (QTableWidget *)0x0;
    }
    pQVar1 = createItem(this);
    (*pQVar1->_vptr_QTableWidgetItem[4])(pQVar1,(ulong)(uint)role,value);
    QTableWidget::setItem(this_00,index->r,index->c,pQVar1);
  }
  else {
    (*pQVar1->_vptr_QTableWidgetItem[4])(pQVar1,(ulong)(uint)role,value);
  }
  return true;
}

Assistant:

bool QTableModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (!index.isValid())
        return false;

    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->setData(role, value);
        return true;
    }

    // don't create dummy table items for empty values
    if (!value.isValid())
        return false;

    QTableWidget *view = this->view();
    if (!view)
        return false;

    itm = createItem();
    itm->setData(role, value);
    view->setItem(index.row(), index.column(), itm);
    return true;
}